

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O0

void __thiscall
MultiANN::NearestNeighbor
          (MultiANN *this,ANNpoint *x,ANNpoint *best_dist,int **best_idx,void ***best_ptr)

{
  double *pdVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  int *in_RDI;
  long *in_R8;
  double dVar14;
  double dVar15;
  int i_3;
  int m_1;
  int ind;
  bool flag;
  double dtheta;
  double norm2;
  double norm1;
  double fd;
  double t1;
  double t;
  int i_2;
  ANNpoint x1;
  int i_1;
  int i;
  double *d_help;
  double *d1;
  int *help_list;
  int *node_list;
  double d;
  int m;
  int l;
  int k;
  int j;
  int n_last;
  int n;
  ANNpoint *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  ANNpoint *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  bool bVar16;
  int *in_stack_ffffffffffffff18;
  ANN *in_stack_ffffffffffffff20;
  double local_d8;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  int local_c0;
  int local_bc;
  int local_b8;
  double local_98;
  int local_7c;
  int local_70;
  int local_6c;
  double local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)in_RDI[8];
  uVar9 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)in_RDI[8];
  uVar9 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar9);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)in_RDI[8];
  uVar9 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar12 = operator_new__(uVar9);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)in_RDI[8];
  uVar9 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar9);
  for (local_6c = 0; local_6c < in_RDI[8]; local_6c = local_6c + 1) {
    *(undefined8 *)(*in_RDX + (long)local_6c * 8) = 0x7ff0000000000000;
    *(undefined8 *)((long)pvVar12 + (long)local_6c * 8) = 0;
    *(undefined8 *)((long)pvVar13 + (long)local_6c * 8) = 0;
    *(undefined4 *)(*in_RCX + (long)local_6c * 4) = 0;
    *(undefined4 *)((long)pvVar10 + (long)local_6c * 4) = 0;
    *(undefined4 *)((long)pvVar11 + (long)local_6c * 4) = 0;
  }
  local_30 = 0;
  for (local_38 = 0x1e; 3 < local_38; local_38 = local_38 + -1) {
    if (*(long *)(in_RDI + (long)local_38 * 2 + 0xe) != 0) {
      ANN::NearestNeighbor
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (ANNpoint)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                 in_stack_fffffffffffffef8,
                 (int **)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      local_40 = 0;
      local_34 = 0;
      local_3c = 0;
      while( true ) {
        in_stack_ffffffffffffff37 = false;
        if ((local_40 < in_RDI[8]) && (in_stack_ffffffffffffff37 = false, local_34 < in_RDI[8])) {
          in_stack_ffffffffffffff37 = local_3c < in_RDI[8];
        }
        if ((bool)in_stack_ffffffffffffff37 == false) break;
        dVar14 = *(double *)(*in_RDX + (long)local_40 * 8);
        pdVar1 = (double *)((long)pvVar12 + (long)local_34 * 8);
        if (dVar14 < *pdVar1 || dVar14 == *pdVar1) {
          *(undefined8 *)((long)pvVar13 + (long)local_3c * 8) =
               *(undefined8 *)(*in_RDX + (long)local_40 * 8);
          *(undefined4 *)((long)pvVar11 + (long)local_3c * 4) =
               *(undefined4 *)(*in_RCX + (long)local_40 * 4);
          local_40 = local_40 + 1;
        }
        else {
          *(undefined8 *)((long)pvVar13 + (long)local_3c * 8) =
               *(undefined8 *)((long)pvVar12 + (long)local_34 * 8);
          *(undefined4 *)((long)pvVar11 + (long)local_3c * 4) =
               *(undefined4 *)((long)pvVar10 + (long)local_34 * 4);
          local_34 = local_34 + 1;
        }
        local_3c = local_3c + 1;
      }
      for (local_70 = 0; local_70 < in_RDI[8]; local_70 = local_70 + 1) {
        *(undefined8 *)(*in_RDX + (long)local_70 * 8) =
             *(undefined8 *)((long)pvVar13 + (long)local_70 * 8);
        *(undefined4 *)(*in_RCX + (long)local_70 * 4) =
             *(undefined4 *)((long)pvVar11 + (long)local_70 * 4);
      }
      local_30 = ANN::LastNode(*(ANN **)(in_RDI + (long)local_38 * 2 + 0xe));
      if (local_30 != *in_RDI) {
        local_30 = local_30 + 1;
      }
    }
  }
  for (local_2c = local_30; local_2c != *in_RDI; local_2c = local_2c + 1) {
    lVar2 = *(long *)(*(long *)(in_RDI + 4) + (long)local_2c * 8);
    local_48 = 0.0;
    for (local_7c = 0; local_7c < in_RDI[1]; local_7c = local_7c + 1) {
      if (*(int *)(*(long *)(in_RDI + 10) + (long)local_7c * 4) == 1) {
        local_48 = *(double *)(*(long *)(in_RDI + 0xc) + (long)local_7c * 8) *
                   (*(double *)(lVar2 + (long)local_7c * 8) -
                   *(double *)(*in_RSI + (long)local_7c * 8)) *
                   *(double *)(*(long *)(in_RDI + 0xc) + (long)local_7c * 8) *
                   (*(double *)(lVar2 + (long)local_7c * 8) -
                   *(double *)(*in_RSI + (long)local_7c * 8)) + local_48;
      }
      else if (*(int *)(*(long *)(in_RDI + 10) + (long)local_7c * 4) == 2) {
        local_d8 = ABS(*(double *)(lVar2 + (long)local_7c * 8) -
                       *(double *)(*in_RSI + (long)local_7c * 8));
        if (6.283185307179586 - local_d8 < local_d8) {
          local_d8 = 6.283185307179586 - local_d8;
        }
        local_48 = *(double *)(*(long *)(in_RDI + 0xc) + (long)local_7c * 8) * local_d8 *
                   *(double *)(*(long *)(in_RDI + 0xc) + (long)local_7c * 8) * local_d8 + local_48;
      }
      else if (*(int *)(*(long *)(in_RDI + 10) + (long)local_7c * 4) == 3) {
        local_98 = *(double *)(lVar2 + (long)(local_7c + 3) * 8) *
                   *(double *)(*in_RSI + (long)(local_7c + 3) * 8) +
                   *(double *)(lVar2 + (long)(local_7c + 2) * 8) *
                   *(double *)(*in_RSI + (long)(local_7c + 2) * 8) +
                   *(double *)(lVar2 + (long)local_7c * 8) *
                   *(double *)(*in_RSI + (long)local_7c * 8) +
                   *(double *)(lVar2 + (long)(local_7c + 1) * 8) *
                   *(double *)(*in_RSI + (long)(local_7c + 1) * 8);
        if (1.0 < local_98) {
          local_98 = local_98 /
                     ((*(double *)(lVar2 + (long)(local_7c + 3) * 8) *
                       *(double *)(lVar2 + (long)(local_7c + 3) * 8) +
                      *(double *)(lVar2 + (long)(local_7c + 2) * 8) *
                      *(double *)(lVar2 + (long)(local_7c + 2) * 8) +
                      *(double *)(lVar2 + (long)local_7c * 8) *
                      *(double *)(lVar2 + (long)local_7c * 8) +
                      *(double *)(lVar2 + (long)(local_7c + 1) * 8) *
                      *(double *)(lVar2 + (long)(local_7c + 1) * 8)) *
                     (*(double *)(*in_RSI + (long)(local_7c + 3) * 8) *
                      *(double *)(*in_RSI + (long)(local_7c + 3) * 8) +
                     *(double *)(*in_RSI + (long)(local_7c + 2) * 8) *
                     *(double *)(*in_RSI + (long)(local_7c + 2) * 8) +
                     *(double *)(*in_RSI + (long)local_7c * 8) *
                     *(double *)(*in_RSI + (long)local_7c * 8) +
                     *(double *)(*in_RSI + (long)(local_7c + 1) * 8) *
                     *(double *)(*in_RSI + (long)(local_7c + 1) * 8)));
        }
        dVar14 = acos(local_98);
        dVar15 = acos(-local_98);
        if (dVar14 <= dVar15) {
          dVar14 = acos(local_98);
        }
        else {
          dVar14 = acos(-local_98);
        }
        local_48 = *(double *)(*(long *)(in_RDI + 0xc) + (long)local_7c * 8) * dVar14 *
                   *(double *)(*(long *)(in_RDI + 0xc) + (long)local_7c * 8) * dVar14 + local_48;
        local_7c = local_7c + 3;
      }
    }
    dVar14 = sqrt(local_48);
    bVar7 = true;
    local_b8 = in_RDI[8] + 2;
    local_34 = 0;
    while( true ) {
      bVar16 = false;
      if (bVar7) {
        bVar16 = local_34 < in_RDI[8];
      }
      if (!bVar16) break;
      if (dVar14 < *(double *)(*in_RDX + (long)local_34 * 8)) {
        bVar7 = false;
        local_b8 = local_34;
      }
      local_34 = local_34 + 1;
    }
    if (local_b8 < in_RDI[8]) {
      iVar8 = in_RDI[8];
      while (local_bc = iVar8 + -1, local_b8 < local_bc) {
        *(undefined8 *)(*in_RDX + (long)local_bc * 8) =
             *(undefined8 *)(*in_RDX + (long)(iVar8 + -2) * 8);
        *(undefined4 *)(*in_RCX + (long)local_bc * 4) =
             *(undefined4 *)(*in_RCX + (long)(iVar8 + -2) * 4);
        iVar8 = local_bc;
      }
      *(int *)(*in_RCX + (long)local_b8 * 4) = local_2c;
      *(double *)(*in_RDX + (long)local_b8 * 8) = dVar14;
    }
  }
  for (local_c0 = 0; local_c0 < in_RDI[8]; local_c0 = local_c0 + 1) {
    *(undefined8 *)(*in_R8 + (long)local_c0 * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 6) + (long)*(int *)(*in_RCX + (long)local_c0 * 4) * 8);
  }
  if (pvVar10 != (void *)0x0) {
    operator_delete__(pvVar10);
  }
  if (pvVar11 != (void *)0x0) {
    operator_delete__(pvVar11);
  }
  if (pvVar13 != (void *)0x0) {
    operator_delete__(pvVar13);
  }
  if (pvVar12 != (void *)0x0) {
    operator_delete__(pvVar12);
  }
  return;
}

Assistant:

void MultiANN::NearestNeighbor(
    const ANNpoint &x,  // query point
    ANNpoint &
        best_dist,     // distances from the  nearest neighbors to x (returned)
    int *&best_idx,    // indices of the nearest neighbors to x (returned)
    void **&best_ptr)  // pointers to the nearest neighbors to x (returned)
{
    int n, n_last, j, k, l, m;
    double d;

    int *node_list = new int[NumNeighbors];
    int *help_list = new int[NumNeighbors];
    double *d1 = new double[NumNeighbors];
    double *d_help = new double[NumNeighbors];

    for (int i = 0; i < NumNeighbors; i++) {
        best_dist[i] = INFINITY;
        d1[i] = 0.0;
        d_help[i] = 0.0;
        best_idx[i] = 0;
        node_list[i] = 0;
        help_list[i] = 0;
    }

    n_last = n = 0;  // Keeps the warnings away

    // Find the nearest neighbor
    // First check the ANN trees
    for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX; k--) {
        if (AnnArray[k]) {
            AnnArray[k]->NearestNeighbor(topology, scaling, x, NumNeighbors, d1,
                                         node_list);
            m = 0;
            j = 0;
            l = 0;
            while (m < NumNeighbors && j < NumNeighbors && l < NumNeighbors) {
                if (best_dist[m] > d1[j]) {
                    d_help[l] = d1[j];
                    help_list[l] = node_list[j];
                    j++;
                    l++;
                } else {
                    d_help[l] = best_dist[m];
                    help_list[l] = best_idx[m];
                    m++;
                    l++;
                }
            }
            for (int i = 0; i < NumNeighbors; i++) {
                best_dist[i] = d_help[i];
                best_idx[i] = help_list[i];
            }
            n_last = AnnArray[k]->LastNode();
            if (n_last != size) n_last++;
        }
    }

    // Check the new nodes, which are not yet in the ANN tree
    for (n = n_last; n != size; n++) {
        ANNpoint x1 = points_coor[n];
        d = 0.0;
        for (int i = 0; i < dimension; i++) {
            if (topology[i] == 1) {
                d += ANN_POW(scaling[i] * (x1[i] - x[i]));
            } else if (topology[i] == 2) {
                double t = fabs(x1[i] - x[i]);
                double t1 = ANN_MIN(t, 2.0 * PI - t);
                d += ANN_POW(scaling[i] * t1);
            } else if (topology[i] == 3) {
                double fd = x1[i] * x[i] + x1[i + 1] * x[i + 1] +
                            x1[i + 2] * x[i + 2] + x1[i + 3] * x[i + 3];
                if (fd > 1) {
                    double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                                   x1[i + 2] * x1[i + 2] +
                                   x1[i + 3] * x1[i + 3];
                    double norm2 = x[i] * x[i] + x[i + 1] * x[i + 1] +
                                   x[i + 2] * x[i + 2] + x[i + 3] * x[i + 3];
                    fd = fd / (norm1 * norm2);
                }
                double dtheta = ANN_MIN(acos(fd), acos(-fd));
                d += ANN_POW(scaling[i] * dtheta);
                i = i + 3;
            }
        }
        d = sqrt(d);
        bool flag = true;
        int ind = NumNeighbors + 2;
        j = 0;
        while (flag && j < NumNeighbors) {
            if (d < best_dist[j]) {
                flag = false;
                ind = j;
            }
            j++;
        }
        if (ind < NumNeighbors) {
            for (int m = (NumNeighbors - 1); m > ind; m--) {
                best_dist[m] = best_dist[m - 1];
                best_idx[m] = best_idx[m - 1];
            }
            best_idx[ind] = n;
            best_dist[ind] = d;
        }
    }

    for (int i = 0; i < NumNeighbors; i++) {
        best_ptr[i] = points_ptr[best_idx[i]];
    }

    delete[] node_list;
    delete[] help_list;
    delete[] d_help;
    delete[] d1;
}